

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

void Io_BlifFree(Io_BlifMan_t *p)

{
  Io_BlifMan_t *p_local;
  
  if (p->pAig != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pAig);
  }
  if ((p->pBuffer != (char *)0x0) && (p->pBuffer != (char *)0x0)) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  if ((p->pObjects != (Io_BlifObj_t *)0x0) && (p->pObjects != (Io_BlifObj_t *)0x0)) {
    free(p->pObjects);
    p->pObjects = (Io_BlifObj_t *)0x0;
  }
  if ((p->pTable != (Io_BlifObj_t **)0x0) && (p->pTable != (Io_BlifObj_t **)0x0)) {
    free(p->pTable);
    p->pTable = (Io_BlifObj_t **)0x0;
  }
  Vec_PtrFree(p->vLines);
  Vec_PtrFree(p->vInputs);
  Vec_PtrFree(p->vOutputs);
  Vec_PtrFree(p->vLatches);
  Vec_PtrFree(p->vNames);
  Vec_PtrFree(p->vTokens);
  Vec_PtrFree(p->vPis);
  Vec_PtrFree(p->vPos);
  Vec_PtrFree(p->vLis);
  Vec_PtrFree(p->vLos);
  if (p != (Io_BlifMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static void Io_BlifFree( Io_BlifMan_t * p )
{
    if ( p->pAig )
        Abc_NtkDelete( p->pAig );
    if ( p->pBuffer )  ABC_FREE( p->pBuffer );
    if ( p->pObjects ) ABC_FREE( p->pObjects );
    if ( p->pTable )   ABC_FREE( p->pTable );
    Vec_PtrFree( p->vLines );
    Vec_PtrFree( p->vInputs );
    Vec_PtrFree( p->vOutputs );
    Vec_PtrFree( p->vLatches );
    Vec_PtrFree( p->vNames );
    Vec_PtrFree( p->vTokens );
    Vec_PtrFree( p->vPis );
    Vec_PtrFree( p->vPos );
    Vec_PtrFree( p->vLis );
    Vec_PtrFree( p->vLos );
    ABC_FREE( p );
}